

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_amount.cpp
# Opt level: O0

Amount cfd::core::operator-(Amount *amount,int64_t satoshi_amount)

{
  int64_t satoshi_amount_00;
  Amount AVar1;
  Amount local_38;
  int64_t local_28;
  int64_t satoshi_amount_local;
  Amount *amount_local;
  
  local_28 = satoshi_amount;
  satoshi_amount_local = (int64_t)amount;
  satoshi_amount_00 = Amount::GetSatoshiValue(amount);
  AVar1 = Amount::CreateBySatoshiAmount(satoshi_amount_00);
  local_38.amount_ = AVar1.amount_;
  local_38.ignore_check_ = AVar1.ignore_check_;
  AVar1 = Amount::operator-=(&local_38,satoshi_amount);
  return AVar1;
}

Assistant:

Amount operator-(const Amount& amount, const int64_t satoshi_amount) {
  return Amount::CreateBySatoshiAmount(amount.GetSatoshiValue()) -=
         satoshi_amount;
}